

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O3

uint16_t wirehair::GetDenseCount(uint N)

{
  uint16_t uVar1;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  uint uVar2;
  
  if (N < 0x800) {
    if (N < 0x41) {
      return (ushort)(byte)kTinyDenseCounts[N];
    }
    if (500 < N) {
      bVar11 = 1000 < N;
      iVar3 = 0x3e;
      if (!bVar11) {
        iVar3 = 0x30;
      }
      iVar9 = 500;
      if (bVar11) {
        iVar9 = 1000;
      }
      iVar10 = 0x23;
      if (bVar11) {
        iVar10 = 0x30;
      }
      iVar8 = 0x800;
      if (!bVar11) {
        iVar8 = 1000;
      }
      uVar4 = (int)((iVar3 - iVar10) * (N - iVar9)) / (iVar8 - iVar9) + iVar10;
      uVar1 = (uint16_t)uVar4;
      switch(uVar4 & 3) {
      case 1:
        goto switchD_001086d8_caseD_1;
      case 2:
        goto switchD_001086d8_caseD_2;
      case 3:
        goto switchD_001086d8_caseD_3;
      }
      goto switchD_001086d8_caseD_0;
    }
    uVar2 = 0x1a;
    uVar6 = 0x40;
    uVar7 = 500;
    uVar4 = 0x23;
  }
  else {
    uVar2 = 0x1f;
    uVar5 = 0;
    uVar4 = 0x3f;
    do {
      uVar6 = uVar2;
      if (*(ushort *)(kDensePoints + (ulong)uVar2 * 4) < N) {
        uVar5 = (ulong)uVar2;
        uVar6 = uVar4;
      }
      uVar2 = uVar6 + (uint)uVar5 >> 1;
      uVar4 = uVar6;
    } while (uVar2 != (uint)uVar5);
    uVar6 = (uint)*(ushort *)(kDensePoints + uVar5 * 4);
    uVar2 = (uint)*(ushort *)(kDensePoints + uVar5 * 4 + 2);
    uVar7 = (uint)*(ushort *)(kDensePoints + uVar5 * 4 + 4);
    uVar4 = (uint)*(ushort *)(kDensePoints + uVar5 * 4 + 6);
  }
  uVar2 = (int)((uVar4 - uVar2) * (N - uVar6)) / (int)(uVar7 - uVar6) + uVar2;
  uVar1 = (uint16_t)uVar2;
  switch(uVar2 & 3) {
  case 1:
switchD_001086d8_caseD_1:
    return uVar1 + 1;
  case 2:
switchD_001086d8_caseD_2:
    return uVar1;
  case 3:
switchD_001086d8_caseD_3:
    return uVar1 + 3;
  }
switchD_001086d8_caseD_0:
  return uVar1 + 2;
}

Assistant:

uint16_t GetDenseCount(unsigned N)
{
    DensePoint lowPoint, highPoint;

    if (N < (kTinyTableCount + kSmallTableCount)) {
        if (N < kTinyTableCount) {
            return kTinyDenseCounts[N];
        }
        else if (N <= 500) {
            lowPoint.N = 64;
            highPoint.N = 500;
            lowPoint.DenseCount = 26;
            highPoint.DenseCount = 35;
        }
        else if (N <= 1000) {
            lowPoint.N = 500;
            highPoint.N = 1000;
            lowPoint.DenseCount = 35;
            highPoint.DenseCount = 48;
        }
        else // if (N < 2048)
        {
            lowPoint.N = 1000;
            highPoint.N = 2048;
            lowPoint.DenseCount = 48;
            highPoint.DenseCount = 62;
        }
    }
    else
    {
        CAT_DEBUG_ASSERT(N >= (kTinyTableCount + kSmallTableCount) && N <= 64000);

        unsigned low = 0;
        unsigned high = kDensePointCount - 1;

        for (;;)
        {
            const unsigned mid = (high + low) / 2;
            if (mid == low) {
                break;
            }

            const DensePoint midPoint = kDensePoints[mid];

            if (N > midPoint.N) {
                low = mid;
            }
            else {
                high = mid;
            }
        }

        CAT_DEBUG_ASSERT(low < kDensePointCount);
        lowPoint = kDensePoints[low];
        CAT_DEBUG_ASSERT(low + 1 < kDensePointCount);
        highPoint = kDensePoints[low + 1];
    }

    CAT_DEBUG_ASSERT(lowPoint.N <= N);
    CAT_DEBUG_ASSERT(highPoint.N >= N);

    uint16_t dense_count = LinearInterpolate(
        lowPoint.N,
        highPoint.N,
        lowPoint.DenseCount,
        highPoint.DenseCount,
        N);

    CAT_DEBUG_ASSERT(dense_count > 0 && dense_count <= kMaxDenseCount);

    // Round up to the next D s.t. D Mod 4 = 2
    switch (dense_count % 4)
    {
    case 0: dense_count += 2; break;
    case 1: dense_count += 1; break;
    case 2: break;
    case 3: dense_count += 3; break;
    }

    return dense_count;
}